

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void __thiscall Json::Reader::skipCommentTokens(Reader *this,Token *token)

{
  if ((this->features_).allowComments_ == true) {
    do {
      readToken(this,token);
    } while (token->type_ == tokenComment);
    return;
  }
  readToken(this,token);
  return;
}

Assistant:

void Reader::skipCommentTokens(Token& token) {
  if (features_.allowComments_) {
    do {
      readToken(token);
    } while (token.type_ == tokenComment);
  } else {
    readToken(token);
  }
}